

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsGetSharedArrayBufferContent
          (JsValueRef sharedArrayBuffer,JsSharedArrayBufferContentHandle *sharedContents)

{
  anon_class_16_2_25d7cca0 fn;
  JsErrorCode JVar1;
  JsSharedArrayBufferContentHandle *local_18;
  JsSharedArrayBufferContentHandle *sharedContents_local;
  JsValueRef sharedArrayBuffer_local;
  
  fn.sharedArrayBuffer = &sharedContents_local;
  fn.sharedContents = &local_18;
  local_18 = sharedContents;
  sharedContents_local = (JsSharedArrayBufferContentHandle *)sharedArrayBuffer;
  JVar1 = ContextAPIWrapper<false,JsGetSharedArrayBufferContent::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsGetSharedArrayBufferContent(_In_ JsValueRef sharedArrayBuffer, _Out_ JsSharedArrayBufferContentHandle *sharedContents)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {

        PARAM_NOT_NULL(sharedContents);

        if (!Js::VarIs<Js::SharedArrayBuffer>(sharedArrayBuffer))
        {
            return JsErrorInvalidArgument;
        }

        Js::SharedContents**& content = (Js::SharedContents**&)sharedContents;
        *content = Js::VarTo<Js::SharedArrayBuffer>(sharedArrayBuffer)->GetSharedContents();

        if (*content == nullptr)
        {
            return JsErrorFatal;
        }

        (*content)->AddRef();

        return JsNoError;
    });
}